

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef find_kinit(jit_State *J,BCIns *endpc,BCReg slot,IRType t)

{
  uint uVar1;
  BCIns *pBVar2;
  uint uVar3;
  int k_00;
  TRef TVar4;
  double *pdVar5;
  double dVar6;
  TRef local_a8;
  int32_t k_1;
  cTValue *tv_1;
  int32_t k;
  BCIns *target;
  BCIns *kpc;
  BCOp op;
  BCIns ins;
  BCIns *startpc;
  BCIns *pc;
  IRType t_local;
  BCReg slot_local;
  BCIns *endpc_local;
  jit_State *J_local;
  TValue tv_2;
  TValue tv;
  
  startpc = endpc + -1;
  while( true ) {
    pBVar2 = startpc;
    if (startpc <= J->pt + 1) {
      return 0;
    }
    uVar1 = *startpc;
    uVar3 = uVar1 & 0xff;
    if (((lj_bc_mode[uVar3] & 7) == 2) && ((uVar1 >> 8 & 0xff) <= slot)) {
      return 0;
    }
    if (((lj_bc_mode[uVar3] & 7) == 1) && ((uVar1 >> 8 & 0xff) == slot)) break;
    startpc = startpc + -1;
  }
  if ((uVar3 != 0x29) && (uVar3 != 0x2a)) {
    return 0;
  }
  for (; J->pt + 1 < startpc; startpc = startpc + -1) {
    if ((((*startpc & 0xff) == 0x58) && (pBVar2 < startpc + ((ulong)(*startpc >> 0x10) - 0x7fff)))
       && (startpc + ((ulong)(*startpc >> 0x10) - 0x7fff) <= endpc)) {
      return 0;
    }
  }
  if (uVar3 == 0x29) {
    k_00 = (int)(short)(uVar1 >> 0x10);
    if (t == IRT_INT) {
      local_a8 = lj_ir_kint(J,k_00);
    }
    else {
      local_a8 = lj_ir_knum_u64(J,(uint64_t)(double)k_00);
    }
    return local_a8;
  }
  pdVar5 = (double *)((J->pt->k).ptr64 + (ulong)(uVar1 >> 0x10) * 8);
  if (t == IRT_INT) {
    dVar6 = (double)(int)*pdVar5;
    if ((*pdVar5 == dVar6) && (!NAN(*pdVar5) && !NAN(dVar6))) {
      TVar4 = lj_ir_kint(J,(int)*pdVar5);
      return TVar4;
    }
    return 0;
  }
  TVar4 = lj_ir_knum_u64(J,(uint64_t)*pdVar5);
  return TVar4;
}

Assistant:

static TRef find_kinit(jit_State *J, const BCIns *endpc, BCReg slot, IRType t)
{
  /* This algorithm is rather simplistic and assumes quite a bit about
  ** how the bytecode is generated. It works fine for FORI initializers,
  ** but it won't necessarily work in other cases (e.g. iterator arguments).
  ** It doesn't do anything fancy, either (like backpropagating MOVs).
  */
  const BCIns *pc, *startpc = proto_bc(J->pt);
  for (pc = endpc-1; pc > startpc; pc--) {
    BCIns ins = *pc;
    BCOp op = bc_op(ins);
    /* First try to find the last instruction that stores to this slot. */
    if (bcmode_a(op) == BCMbase && bc_a(ins) <= slot) {
      return 0;  /* Multiple results, e.g. from a CALL or KNIL. */
    } else if (bcmode_a(op) == BCMdst && bc_a(ins) == slot) {
      if (op == BC_KSHORT || op == BC_KNUM) {  /* Found const. initializer. */
	/* Now try to verify there's no forward jump across it. */
	const BCIns *kpc = pc;
	for (; pc > startpc; pc--)
	  if (bc_op(*pc) == BC_JMP) {
	    const BCIns *target = pc+bc_j(*pc)+1;
	    if (target > kpc && target <= endpc)
	      return 0;  /* Conditional assignment. */
	  }
	if (op == BC_KSHORT) {
	  int32_t k = (int32_t)(int16_t)bc_d(ins);
	  return t == IRT_INT ? lj_ir_kint(J, k) : lj_ir_knum(J, (lua_Number)k);
	} else {
	  cTValue *tv = proto_knumtv(J->pt, bc_d(ins));
	  if (t == IRT_INT) {
	    int32_t k = numberVint(tv);
	    if (tvisint(tv) || numV(tv) == (lua_Number)k)  /* -0 is ok here. */
	      return lj_ir_kint(J, k);
	    return 0;  /* Type mismatch. */
	  } else {
	    return lj_ir_knum(J, numberVnum(tv));
	  }
	}
      }
      return 0;  /* Non-constant initializer. */
    }
  }
  return 0;  /* No assignment to this slot found? */
}